

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeCache.cxx
# Opt level: O0

bool __thiscall cmFileTimeCache::Compare(cmFileTimeCache *this,string *f1,string *f2,int *result)

{
  bool bVar1;
  int iVar2;
  cmFileTime local_40;
  cmFileTime ft2;
  cmFileTime ft1;
  int *result_local;
  string *f2_local;
  string *f1_local;
  cmFileTimeCache *this_local;
  
  cmFileTime::cmFileTime(&ft2);
  cmFileTime::cmFileTime(&local_40);
  bVar1 = Load(this,f1,&ft2);
  if ((bVar1) && (bVar1 = Load(this,f2,&local_40), bVar1)) {
    iVar2 = cmFileTime::Compare(&ft2,&local_40);
    *result = iVar2;
    this_local._7_1_ = true;
  }
  else {
    *result = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimeCache::Compare(std::string const& f1, std::string const& f2,
                              int* result)
{
  // Get the modification time for each file.
  cmFileTime ft1, ft2;
  if (this->Load(f1, ft1) && this->Load(f2, ft2)) {
    // Compare the two modification times.
    *result = ft1.Compare(ft2);
    return true;
  }
  // No comparison available.  Default to the same time.
  *result = 0;
  return false;
}